

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_push_indent(fy_parser *fyp,int indent,_Bool generated_block_map)

{
  fy_indent *_n;
  char *pcVar1;
  fy_indent *fyit;
  _Bool generated_block_map_local;
  int indent_local;
  fy_parser *fyp_local;
  
  _n = fy_parse_indent_alloc(fyp);
  if (_n == (fy_indent *)0x0) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x367,"fy_push_indent","fy_indent_alloc() failed");
    fyp_local._4_4_ = -1;
  }
  else {
    _n->indent = fyp->indent;
    _n->field_0x14 = _n->field_0x14 & 0xfe | (byte)(*(ushort *)&fyp->field_0x70 >> 5) & 1;
    fy_indent_list_push(&fyp->indent_stack,_n);
    fyp->parent_indent = fyp->indent;
    fyp->indent = indent;
    *(ushort *)&fyp->field_0x70 =
         *(ushort *)&fyp->field_0x70 & 0xffdf | (ushort)generated_block_map << 5;
    pcVar1 = "false";
    if ((*(ushort *)&fyp->field_0x70 >> 5 & 1) != 0) {
      pcVar1 = "true";
    }
    fy_parser_diag(fyp,0x20,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x376,"fy_push_indent","push_indent %d -> %d - generated_block_map=%s\n",
                   fyp->parent_indent,fyp->indent,pcVar1);
    fyp_local._4_4_ = 0;
  }
  return fyp_local._4_4_;
}

Assistant:

int fy_push_indent(struct fy_parser *fyp, int indent, bool generated_block_map) {
    struct fy_indent *fyit;

    fyit = fy_parse_indent_alloc(fyp);
    fyp_error_check(fyp, fyit != NULL, err_out,
                    "fy_indent_alloc() failed");

    fyit->indent = fyp->indent;
    fyit->generated_block_map = fyp->generated_block_map;

    /* push */
    fy_indent_list_push(&fyp->indent_stack, fyit);

    /* update current state */
    fyp->parent_indent = fyp->indent;
    fyp->indent = indent;
    fyp->generated_block_map = generated_block_map;

    fyp_scan_debug(fyp, "push_indent %d -> %d - generated_block_map=%s\n",
                   fyp->parent_indent, fyp->indent,
                   fyp->generated_block_map ? "true" : "false");

    return 0;

    err_out:
    return -1;
}